

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultilineTextBox.cpp
# Opt level: O1

Vector2<unsigned_long> __thiscall
gui::MultilineTextBox::findCaretPosition(MultilineTextBox *this,size_t caretOffset)

{
  size_t sVar1;
  long lVar2;
  unsigned_long uVar3;
  Vector2<unsigned_long> VVar4;
  
  sVar1 = sf::String::getSize((this->boxStrings_).
                              super__Vector_base<sf::String,_std::allocator<sf::String>_>._M_impl.
                              super__Vector_impl_data._M_start);
  if (sVar1 < caretOffset) {
    lVar2 = 0x20;
    uVar3 = 0;
    do {
      sVar1 = sf::String::getSize((String *)
                                  ((long)&(this->boxStrings_).
                                          super__Vector_base<sf::String,_std::allocator<sf::String>_>
                                          ._M_impl.super__Vector_impl_data._M_start[-1].m_string.
                                          _M_dataplus._M_p + lVar2));
      caretOffset = caretOffset + ~sVar1;
      uVar3 = uVar3 + 1;
      sVar1 = sf::String::getSize((String *)
                                  ((long)&(((this->boxStrings_).
                                            super__Vector_base<sf::String,_std::allocator<sf::String>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->m_string).
                                          _M_dataplus._M_p + lVar2));
      lVar2 = lVar2 + 0x20;
    } while (sVar1 < caretOffset);
  }
  else {
    uVar3 = 0;
  }
  VVar4.y = uVar3;
  VVar4.x = caretOffset;
  return VVar4;
}

Assistant:

sf::Vector2<size_t> MultilineTextBox::findCaretPosition(size_t caretOffset) const {
    size_t y = 0;
    size_t caretRemaining = caretOffset;
    while (caretRemaining > boxStrings_[y].getSize()) {
        caretRemaining -= boxStrings_[y].getSize() + 1;
        ++y;
    }
    return {caretRemaining, y};
}